

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

Cord * __thiscall absl::lts_20240722::Cord::operator=(Cord *this,string_view src)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  byte bVar3;
  CordzUpdateScope CVar4;
  CordzInfo *in_RAX;
  CordzInfo *pCVar5;
  Nullable<CordRep_*> pCVar6;
  SamplingState *pSVar7;
  long lVar8;
  sbyte sVar9;
  Nullable<const_char_*> data;
  size_t extraout_RDX;
  size_t alloc_hint;
  size_t extraout_RDX_00;
  sbyte sVar10;
  ulong length;
  size_t sVar11;
  CordRep *node;
  CordzUpdateScope scope;
  CordzUpdateScope local_28;
  
  data = src._M_str;
  length = src._M_len;
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    node = (CordRep *)0x0;
  }
  else {
    node = (this->contents_).data_.rep_.field_0.as_tree.rep;
  }
  if (length < 0x10) {
    if (node == (CordRep *)0x0) {
      cord_internal::InlineData::set_inline_data((InlineData *)this,data,length);
      return this;
    }
    local_28.info_ = in_RAX;
    pCVar5 = cord_internal::InlineData::cordz_info((InlineData *)this);
    if (pCVar5 != (CordzInfo *)0x0) {
      absl::lts_20240722::cord_internal::CordzInfo::Untrack();
    }
    cord_internal::InlineData::set_inline_data((InlineData *)this,data,length);
    LOCK();
    pRVar1 = &node->refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) != 0 || 0 < (int)uVar2) {
      if (uVar2 != 2) {
        return this;
      }
      absl::lts_20240722::cord_internal::CordRep::Destroy(node);
      return this;
    }
  }
  else {
    if (node == (CordRep *)0x0) {
      pCVar6 = NewTree(data,length,(size_t)data);
      if (pCVar6 == (Nullable<CordRep_*>)0x0) {
        __assert_fail("rep",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x4f2,
                      "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                     );
      }
      (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar6;
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
      pSVar7 = (SamplingState *)__tls_get_addr(&PTR_0011efd0);
      if (pSVar7->next_sample < 2) {
        lVar8 = absl::lts_20240722::cord_internal::cordz_should_profile_slow(pSVar7);
      }
      else {
        pSVar7->next_sample = pSVar7->next_sample + -1;
        lVar8 = 0;
      }
      if (lVar8 < 1) {
        return this;
      }
      absl::lts_20240722::cord_internal::CordzInfo::TrackCord
                ((InlineData *)this,kAssignString,lVar8);
      return this;
    }
    local_28.info_ = cord_internal::InlineData::cordz_info((InlineData *)this);
    alloc_hint = extraout_RDX;
    if (local_28.info_ != (CordzInfo *)0x0) {
      absl::lts_20240722::cord_internal::CordzInfo::Lock((MethodIdentifier)local_28.info_);
      alloc_hint = extraout_RDX_00;
    }
    bVar3 = node->tag;
    if (5 < bVar3) {
      if ((bVar3 - 0xf9 < 7) || (bVar3 < 6)) {
LAB_0010c4d4:
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
      }
      alloc_hint = 0xfff48000;
      if (bVar3 < 0xbb) {
        alloc_hint = 0xfffff180;
      }
      sVar10 = 0xc;
      if (bVar3 < 0xbb) {
        sVar10 = 6;
      }
      sVar11 = 0xfffffff0;
      if (0x42 < bVar3) {
        sVar11 = alloc_hint;
      }
      sVar9 = 3;
      if (0x42 < bVar3) {
        sVar9 = sVar10;
      }
      if ((length <= (ulong)(long)(int)(((uint)bVar3 << sVar9) + (int)sVar11 + -0xd)) &&
         ((node->refcount).count_.super___atomic_base<int>._M_i == 2)) {
        if ((node->tag - 0xf9 < 7) || (node->tag < 6)) goto LAB_0010c4d4;
        memmove(node->storage,data,length);
        node->length = length;
        VerifyTree(node);
        goto LAB_0010c40d;
      }
    }
    pCVar6 = NewTree(data,length,alloc_hint);
    CVar4.info_ = local_28.info_;
    if (pCVar6 == (Nullable<CordRep_*>)0x0) {
      __assert_fail("rep",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.h"
                    ,0x500,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
      __assert_fail("data_.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.h"
                    ,0x501,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar6;
    if (local_28.info_ != (CordzInfo *)0x0) {
      absl::lts_20240722::Mutex::AssertHeld();
      *(Nullable<CordRep_*> *)(CVar4.info_ + 0x40) = pCVar6;
    }
    LOCK();
    pRVar1 = &node->refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) != 0 || 0 < (int)uVar2) {
      if (uVar2 == 2) {
        absl::lts_20240722::cord_internal::CordRep::Destroy(node);
      }
LAB_0010c40d:
      cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_28);
      return this;
    }
  }
  __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0xaa,"bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
}

Assistant:

Cord& Cord::operator=(absl::string_view src) {
  auto constexpr method = CordzUpdateTracker::kAssignString;
  const char* data = src.data();
  size_t length = src.size();
  CordRep* tree = contents_.tree();
  if (length <= InlineRep::kMaxInline) {
    // Embed into this->contents_, which is somewhat subtle:
    // - MaybeUntrackCord must be called before Unref(tree).
    // - MaybeUntrackCord must be called before set_data() clobbers cordz_info.
    // - set_data() must be called before Unref(tree) as it may reference tree.
    if (tree != nullptr) CordzInfo::MaybeUntrackCord(contents_.cordz_info());
    contents_.set_data(data, length);
    if (tree != nullptr) CordRep::Unref(tree);
    return *this;
  }
  if (tree != nullptr) {
    CordzUpdateScope scope(contents_.cordz_info(), method);
    if (tree->IsFlat() && tree->flat()->Capacity() >= length &&
        tree->refcount.IsOne()) {
      // Copy in place if the existing FLAT node is reusable.
      memmove(tree->flat()->Data(), data, length);
      tree->length = length;
      VerifyTree(tree);
      return *this;
    }
    contents_.SetTree(NewTree(data, length, 0), scope);
    CordRep::Unref(tree);
  } else {
    contents_.EmplaceTree(NewTree(data, length, 0), method);
  }
  return *this;
}